

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void explainOneScan(Parse *pParse,SrcList *pTabList,WhereLevel *pLevel,int iLevel,int iFrom,
                   u16 wctrlFlags)

{
  byte bVar1;
  uint uVar2;
  int p1;
  Vdbe *p;
  sqlite3 *db_00;
  sqlite3_index_info *psVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  bool bVar8;
  char *local_b0;
  sqlite3_index_info *pVtabIdx;
  char *zWhere;
  int isSearch;
  int iId;
  sqlite3_int64 nRow;
  char *zMsg;
  sqlite3 *db;
  Vdbe *v;
  SrcList_item *pItem;
  u32 flags;
  u16 wctrlFlags_local;
  int iFrom_local;
  int iLevel_local;
  WhereLevel *pLevel_local;
  SrcList *pTabList_local;
  Parse *pParse_local;
  
  if (pParse->explain == '\x02') {
    uVar2 = (pLevel->plan).wsFlags;
    bVar1 = pLevel->iFrom;
    p = pParse->pVdbe;
    db_00 = pParse->db;
    p1 = pParse->iSelectId;
    if (((uVar2 & 0x10000000) == 0) && ((wctrlFlags & 0x40) == 0)) {
      bVar8 = true;
      if (((pLevel->plan).nEq == 0) && (bVar8 = true, (uVar2 & 0x300000) == 0)) {
        bVar8 = (wctrlFlags & 3) != 0;
      }
      pcVar7 = "SCAN";
      if (bVar8) {
        pcVar7 = "SEARCH";
      }
      pcVar7 = sqlite3MPrintf(db_00,"%s",pcVar7);
      if (pTabList->a[bVar1].pSelect == (Select *)0x0) {
        nRow = (sqlite3_int64)
               sqlite3MAppendf(db_00,pcVar7,"%s TABLE %s",pcVar7,pTabList->a[bVar1].zName);
      }
      else {
        nRow = (sqlite3_int64)
               sqlite3MAppendf(db_00,pcVar7,"%s SUBQUERY %d",pcVar7,
                               (ulong)pTabList->a[bVar1].iSelectId);
      }
      if (pTabList->a[bVar1].zAlias != (char *)0x0) {
        nRow = (sqlite3_int64)
               sqlite3MAppendf(db_00,(char *)nRow,"%s AS %s",nRow,pTabList->a[bVar1].zAlias);
      }
      if ((uVar2 & 0xf0000) == 0) {
        if ((uVar2 & 0x3000) == 0) {
          if ((uVar2 & 0x8000000) != 0) {
            psVar3 = (pLevel->plan).u.pVtabIdx;
            nRow = (sqlite3_int64)
                   sqlite3MAppendf(db_00,(char *)nRow,"%s VIRTUAL TABLE INDEX %d:%s",nRow,
                                   (ulong)(uint)psVar3->idxNum,psVar3->idxStr);
          }
        }
        else {
          nRow = (sqlite3_int64)
                 sqlite3MAppendf(db_00,(char *)nRow,"%s USING INTEGER PRIMARY KEY",nRow);
          if ((uVar2 & 0x1000) == 0) {
            if ((uVar2 & 0x300000) == 0x300000) {
              nRow = (sqlite3_int64)
                     sqlite3MAppendf(db_00,(char *)nRow,"%s (rowid>? AND rowid<?)",nRow);
            }
            else if ((uVar2 & 0x200000) == 0) {
              if ((uVar2 & 0x100000) != 0) {
                nRow = (sqlite3_int64)sqlite3MAppendf(db_00,(char *)nRow,"%s (rowid<?)",nRow);
              }
            }
            else {
              nRow = (sqlite3_int64)sqlite3MAppendf(db_00,(char *)nRow,"%s (rowid>?)",nRow);
            }
          }
          else {
            nRow = (sqlite3_int64)sqlite3MAppendf(db_00,(char *)nRow,"%s (rowid=?)",nRow);
          }
        }
      }
      else {
        pcVar7 = explainIndexRange(db_00,pLevel,pTabList->a[bVar1].pTab);
        pcVar4 = "";
        if ((uVar2 & 0x20000000) != 0) {
          pcVar4 = "AUTOMATIC ";
        }
        pcVar5 = "";
        if ((uVar2 & 0x400000) != 0) {
          pcVar5 = "COVERING ";
        }
        pcVar6 = " ";
        if ((uVar2 & 0x20000000) != 0) {
          pcVar6 = "";
        }
        if ((uVar2 & 0x20000000) == 0) {
          local_b0 = ((pLevel->plan).u.pIdx)->zName;
        }
        else {
          local_b0 = "";
        }
        nRow = (sqlite3_int64)
               sqlite3MAppendf(db_00,(char *)nRow,"%s USING %s%sINDEX%s%s%s",nRow,pcVar4,pcVar5,
                               pcVar6,local_b0,pcVar7);
        sqlite3DbFree(db_00,pcVar7);
      }
      if ((wctrlFlags & 3) == 0) {
        _isSearch = (long)(pLevel->plan).nRow;
      }
      else {
        _isSearch = 1;
      }
      pcVar7 = sqlite3MAppendf(db_00,(char *)nRow,"%s (~%lld rows)",nRow,_isSearch);
      sqlite3VdbeAddOp4(p,0x96,p1,iLevel,iFrom,pcVar7,-1);
    }
  }
  return;
}

Assistant:

static void explainOneScan(
  Parse *pParse,                  /* Parse context */
  SrcList *pTabList,              /* Table list this loop refers to */
  WhereLevel *pLevel,             /* Scan to write OP_Explain opcode for */
  int iLevel,                     /* Value for "level" column of output */
  int iFrom,                      /* Value for "from" column of output */
  u16 wctrlFlags                  /* Flags passed to sqlite3WhereBegin() */
){
  if( pParse->explain==2 ){
    u32 flags = pLevel->plan.wsFlags;
    struct SrcList_item *pItem = &pTabList->a[pLevel->iFrom];
    Vdbe *v = pParse->pVdbe;      /* VM being constructed */
    sqlite3 *db = pParse->db;     /* Database handle */
    char *zMsg;                   /* Text to add to EQP output */
    sqlite3_int64 nRow;           /* Expected number of rows visited by scan */
    int iId = pParse->iSelectId;  /* Select id (left-most output column) */
    int isSearch;                 /* True for a SEARCH. False for SCAN. */

    if( (flags&WHERE_MULTI_OR) || (wctrlFlags&WHERE_ONETABLE_ONLY) ) return;

    isSearch = (pLevel->plan.nEq>0)
             || (flags&(WHERE_BTM_LIMIT|WHERE_TOP_LIMIT))!=0
             || (wctrlFlags&(WHERE_ORDERBY_MIN|WHERE_ORDERBY_MAX));

    zMsg = sqlite3MPrintf(db, "%s", isSearch?"SEARCH":"SCAN");
    if( pItem->pSelect ){
      zMsg = sqlite3MAppendf(db, zMsg, "%s SUBQUERY %d", zMsg,pItem->iSelectId);
    }else{
      zMsg = sqlite3MAppendf(db, zMsg, "%s TABLE %s", zMsg, pItem->zName);
    }

    if( pItem->zAlias ){
      zMsg = sqlite3MAppendf(db, zMsg, "%s AS %s", zMsg, pItem->zAlias);
    }
    if( (flags & WHERE_INDEXED)!=0 ){
      char *zWhere = explainIndexRange(db, pLevel, pItem->pTab);
      zMsg = sqlite3MAppendf(db, zMsg, "%s USING %s%sINDEX%s%s%s", zMsg, 
          ((flags & WHERE_TEMP_INDEX)?"AUTOMATIC ":""),
          ((flags & WHERE_IDX_ONLY)?"COVERING ":""),
          ((flags & WHERE_TEMP_INDEX)?"":" "),
          ((flags & WHERE_TEMP_INDEX)?"": pLevel->plan.u.pIdx->zName),
          zWhere
      );
      sqlite3DbFree(db, zWhere);
    }else if( flags & (WHERE_ROWID_EQ|WHERE_ROWID_RANGE) ){
      zMsg = sqlite3MAppendf(db, zMsg, "%s USING INTEGER PRIMARY KEY", zMsg);

      if( flags&WHERE_ROWID_EQ ){
        zMsg = sqlite3MAppendf(db, zMsg, "%s (rowid=?)", zMsg);
      }else if( (flags&WHERE_BOTH_LIMIT)==WHERE_BOTH_LIMIT ){
        zMsg = sqlite3MAppendf(db, zMsg, "%s (rowid>? AND rowid<?)", zMsg);
      }else if( flags&WHERE_BTM_LIMIT ){
        zMsg = sqlite3MAppendf(db, zMsg, "%s (rowid>?)", zMsg);
      }else if( flags&WHERE_TOP_LIMIT ){
        zMsg = sqlite3MAppendf(db, zMsg, "%s (rowid<?)", zMsg);
      }
    }
#ifndef SQLITE_OMIT_VIRTUALTABLE
    else if( (flags & WHERE_VIRTUALTABLE)!=0 ){
      sqlite3_index_info *pVtabIdx = pLevel->plan.u.pVtabIdx;
      zMsg = sqlite3MAppendf(db, zMsg, "%s VIRTUAL TABLE INDEX %d:%s", zMsg,
                  pVtabIdx->idxNum, pVtabIdx->idxStr);
    }
#endif
    if( wctrlFlags&(WHERE_ORDERBY_MIN|WHERE_ORDERBY_MAX) ){
      testcase( wctrlFlags & WHERE_ORDERBY_MIN );
      nRow = 1;
    }else{
      nRow = (sqlite3_int64)pLevel->plan.nRow;
    }
    zMsg = sqlite3MAppendf(db, zMsg, "%s (~%lld rows)", zMsg, nRow);
    sqlite3VdbeAddOp4(v, OP_Explain, iId, iLevel, iFrom, zMsg, P4_DYNAMIC);
  }
}